

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  undefined8 *puVar15;
  float *pfVar16;
  float *pfVar17;
  int iVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  ushort uVar21;
  ushort uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  Geometry *pGVar26;
  RTCFilterFunctionN p_Var27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  byte bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [12];
  int iVar48;
  AABBNodeMB4D *node1;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  Geometry *pGVar52;
  size_t sVar53;
  uint uVar54;
  size_t sVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  NodeRef *pNVar64;
  ulong uVar65;
  ulong uVar66;
  bool bVar67;
  byte bVar68;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar91;
  uint uVar109;
  uint uVar110;
  vint4 ai;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar111;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  uint uVar113;
  uint uVar123;
  uint uVar125;
  vint4 ai_2;
  undefined1 auVar114 [16];
  uint uVar127;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar124;
  float fVar126;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  uint uVar128;
  uint uVar132;
  uint uVar133;
  vint4 bi;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint uVar134;
  vint4 ai_5;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar142;
  float fVar149;
  float fVar150;
  vint4 ai_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  uint uVar152;
  float fVar161;
  uint uVar163;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar162;
  uint uVar164;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar165;
  float fVar174;
  float fVar176;
  vint4 ai_7;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar167;
  float fVar166;
  float fVar179;
  undefined1 auVar168 [16];
  float fVar175;
  float fVar177;
  float fVar180;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar178;
  float fVar181;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar187 [16];
  float fVar192;
  float fVar197;
  float fVar202;
  undefined1 auVar188 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar213;
  float fVar214;
  undefined1 auVar210 [16];
  float fVar215;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar219;
  float fVar220;
  float fVar222;
  undefined1 auVar217 [16];
  float fVar221;
  float fVar223;
  undefined1 auVar218 [16];
  float fVar224;
  float fVar228;
  float fVar229;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar230;
  undefined1 auVar227 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  UVIdentity<4> mapUV;
  byte local_d38;
  float fStack_d04;
  float old_t;
  undefined4 uStack_ce4;
  undefined8 uStack_ce0;
  undefined8 local_cc8;
  float fStack_cc0;
  float fStack_cbc;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  byte local_ca8;
  undefined8 local_c98;
  undefined1 local_c88 [16];
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  float old_t_1;
  undefined8 uStack_c50;
  undefined1 (*local_c40) [16];
  long local_c38;
  long local_c30;
  RTCFilterFunctionNArguments args;
  float fStack_be0;
  float fStack_bdc;
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  vint4 bi_2;
  vint4 bi_4;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined1 local_998 [16];
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  uint local_968;
  uint uStack_964;
  uint uStack_960;
  uint uStack_95c;
  uint local_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 local_8a8;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack [244];
  
  pNVar64 = stack + 1;
  stack[0] = root;
  local_8e8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_8f8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_908 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_918 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar182 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar142 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar208 = local_918 * 0.99999964;
  fVar216 = fVar182 * 0.99999964;
  fVar204 = fVar142 * 0.99999964;
  local_918 = local_918 * 1.0000004;
  fVar182 = fVar182 * 1.0000004;
  fVar142 = fVar142 * 1.0000004;
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar18 = (tray->tnear).field_0.i[k];
  aVar167.i[1] = iVar18;
  aVar167.i[0] = iVar18;
  aVar167.i[2] = iVar18;
  aVar167.i[3] = iVar18;
  iVar18 = (tray->tfar).field_0.i[k];
  auVar153._4_4_ = iVar18;
  auVar153._0_4_ = iVar18;
  auVar153._8_4_ = iVar18;
  auVar153._12_4_ = iVar18;
  local_c40 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar67 = true;
  bi_2.field_0 = aVar167;
  sVar55 = k;
  fStack_8f4 = local_8f8;
  fStack_8f0 = local_8f8;
  fStack_8ec = local_8f8;
  fStack_904 = local_908;
  fStack_900 = local_908;
  fStack_8fc = local_908;
  fStack_914 = local_918;
  fStack_910 = local_918;
  fStack_90c = local_918;
  fStack_8e4 = local_8e8;
  fStack_8e0 = local_8e8;
  fStack_8dc = local_8e8;
  do {
    sVar53 = pNVar64[-1].ptr;
    pNVar64 = pNVar64 + -1;
    while ((sVar53 & 8) == 0) {
      uVar49 = sVar53 & 0xfffffffffffffff0;
      fVar200 = *(float *)(ray + k * 4 + 0x70);
      pfVar17 = (float *)(uVar49 + 0x80 + uVar65);
      pfVar16 = (float *)(uVar49 + 0x20 + uVar65);
      auVar114._0_4_ = ((*pfVar17 * fVar200 + *pfVar16) - local_8e8) * fVar208;
      auVar114._4_4_ = ((pfVar17[1] * fVar200 + pfVar16[1]) - fStack_8e4) * fVar208;
      auVar114._8_4_ = ((pfVar17[2] * fVar200 + pfVar16[2]) - fStack_8e0) * fVar208;
      auVar114._12_4_ = ((pfVar17[3] * fVar200 + pfVar16[3]) - fStack_8dc) * fVar208;
      pfVar17 = (float *)(uVar49 + 0x80 + uVar62);
      pfVar16 = (float *)(uVar49 + 0x20 + uVar62);
      auVar145._0_4_ = ((*pfVar17 * fVar200 + *pfVar16) - local_8f8) * fVar216;
      auVar145._4_4_ = ((pfVar17[1] * fVar200 + pfVar16[1]) - fStack_8f4) * fVar216;
      auVar145._8_4_ = ((pfVar17[2] * fVar200 + pfVar16[2]) - fStack_8f0) * fVar216;
      auVar145._12_4_ = ((pfVar17[3] * fVar200 + pfVar16[3]) - fStack_8ec) * fVar216;
      pfVar17 = (float *)(uVar49 + 0x80 + uVar66);
      pfVar16 = (float *)(uVar49 + 0x20 + uVar66);
      auVar92._0_4_ = ((*pfVar17 * fVar200 + *pfVar16) - local_908) * fVar204;
      auVar92._4_4_ = ((pfVar17[1] * fVar200 + pfVar16[1]) - fStack_904) * fVar204;
      auVar92._8_4_ = ((pfVar17[2] * fVar200 + pfVar16[2]) - fStack_900) * fVar204;
      auVar92._12_4_ = ((pfVar17[3] * fVar200 + pfVar16[3]) - fStack_8fc) * fVar204;
      auVar129 = maxps(auVar145,auVar92);
      auVar92 = maxps((undefined1  [16])aVar167,auVar114);
      auVar92 = maxps(auVar92,auVar129);
      pfVar17 = (float *)(uVar49 + 0x80 + (uVar65 ^ 0x10));
      pfVar16 = (float *)(uVar49 + 0x20 + (uVar65 ^ 0x10));
      auVar155._0_4_ = ((*pfVar17 * fVar200 + *pfVar16) - local_8e8) * local_918;
      auVar155._4_4_ = ((pfVar17[1] * fVar200 + pfVar16[1]) - fStack_8e4) * fStack_914;
      auVar155._8_4_ = ((pfVar17[2] * fVar200 + pfVar16[2]) - fStack_8e0) * fStack_910;
      auVar155._12_4_ = ((pfVar17[3] * fVar200 + pfVar16[3]) - fStack_8dc) * fStack_90c;
      pfVar17 = (float *)(uVar49 + 0x80 + (uVar62 ^ 0x10));
      pfVar16 = (float *)(uVar49 + 0x20 + (uVar62 ^ 0x10));
      auVar171._0_4_ = ((*pfVar17 * fVar200 + *pfVar16) - local_8f8) * fVar182;
      auVar171._4_4_ = ((pfVar17[1] * fVar200 + pfVar16[1]) - fStack_8f4) * fVar182;
      auVar171._8_4_ = ((pfVar17[2] * fVar200 + pfVar16[2]) - fStack_8f0) * fVar182;
      auVar171._12_4_ = ((pfVar17[3] * fVar200 + pfVar16[3]) - fStack_8ec) * fVar182;
      pfVar17 = (float *)(uVar49 + 0x80 + (uVar66 ^ 0x10));
      pfVar16 = (float *)(uVar49 + 0x20 + (uVar66 ^ 0x10));
      auVar129._0_4_ = ((*pfVar17 * fVar200 + *pfVar16) - local_908) * fVar142;
      auVar129._4_4_ = ((pfVar17[1] * fVar200 + pfVar16[1]) - fStack_904) * fVar142;
      auVar129._8_4_ = ((pfVar17[2] * fVar200 + pfVar16[2]) - fStack_900) * fVar142;
      auVar129._12_4_ = ((pfVar17[3] * fVar200 + pfVar16[3]) - fStack_8fc) * fVar142;
      auVar129 = minps(auVar171,auVar129);
      auVar114 = minps(auVar153,auVar155);
      auVar114 = minps(auVar114,auVar129);
      bVar29 = auVar92._0_4_ <= auVar114._0_4_;
      bVar30 = auVar92._4_4_ <= auVar114._4_4_;
      bVar31 = auVar92._8_4_ <= auVar114._8_4_;
      bVar32 = auVar92._12_4_ <= auVar114._12_4_;
      if (((uint)sVar53 & 7) == 6) {
        bVar29 = (fVar200 < *(float *)(uVar49 + 0xf0) && *(float *)(uVar49 + 0xe0) <= fVar200) &&
                 bVar29;
        bVar30 = (fVar200 < *(float *)(uVar49 + 0xf4) && *(float *)(uVar49 + 0xe4) <= fVar200) &&
                 bVar30;
        bVar31 = (fVar200 < *(float *)(uVar49 + 0xf8) && *(float *)(uVar49 + 0xe8) <= fVar200) &&
                 bVar31;
        bVar32 = (fVar200 < *(float *)(uVar49 + 0xfc) && *(float *)(uVar49 + 0xec) <= fVar200) &&
                 bVar32;
      }
      auVar93._0_4_ = (uint)bVar29 * -0x80000000;
      auVar93._4_4_ = (uint)bVar30 * -0x80000000;
      auVar93._8_4_ = (uint)bVar31 * -0x80000000;
      auVar93._12_4_ = (uint)bVar32 * -0x80000000;
      uVar54 = movmskps((int)sVar55,auVar93);
      sVar55 = (size_t)uVar54;
      if (uVar54 == 0) goto LAB_002a295a;
      sVar55 = (size_t)(byte)uVar54;
      lVar60 = 0;
      if (sVar55 != 0) {
        for (; ((byte)uVar54 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
        }
      }
      sVar53 = *(size_t *)(uVar49 + lVar60 * 8);
      uVar54 = (uVar54 & 0xff) - 1 & uVar54 & 0xff;
      if (uVar54 != 0) {
        pNVar64->ptr = sVar53;
        pNVar64 = pNVar64 + 1;
        lVar60 = 0;
        if (uVar54 != 0) {
          for (; (uVar54 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
          }
        }
        sVar53 = *(size_t *)(uVar49 + lVar60 * 8);
        uVar54 = uVar54 - 1 & uVar54;
        sVar55 = (size_t)uVar54;
        if (uVar54 != 0) {
          do {
            pNVar64->ptr = sVar53;
            pNVar64 = pNVar64 + 1;
            lVar60 = 0;
            if (sVar55 != 0) {
              for (; (sVar55 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
              }
            }
            sVar53 = *(size_t *)(uVar49 + lVar60 * 8);
            sVar55 = sVar55 & sVar55 - 1;
          } while (sVar55 != 0);
        }
      }
    }
    sVar55 = (ulong)((uint)sVar53 & 0xf) - 8;
    if (sVar55 != 0) {
      uVar49 = sVar53 & 0xfffffffffffffff0;
      sVar53 = 0;
      do {
        lVar60 = sVar53 * 0x90;
        fVar112 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar49 + 0x80 + lVar60)) *
                  *(float *)(uVar49 + 0x84 + lVar60);
        uVar59 = *(ulong *)(uVar49 + 0x20 + lVar60);
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar59;
        uVar51 = *(ulong *)(uVar49 + 0x24 + lVar60);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar51;
        bVar33 = (byte)uVar51;
        bVar68 = (byte)uVar59;
        bVar34 = (byte)(uVar51 >> 8);
        bVar85 = (byte)(uVar59 >> 8);
        bVar35 = (byte)(uVar51 >> 0x10);
        bVar86 = (byte)(uVar59 >> 0x10);
        bVar36 = (byte)(uVar51 >> 0x18);
        bVar87 = (byte)(uVar59 >> 0x18);
        bVar37 = (byte)(uVar51 >> 0x20);
        bVar88 = (byte)(uVar59 >> 0x20);
        bVar38 = (byte)(uVar51 >> 0x28);
        bVar89 = (byte)(uVar59 >> 0x28);
        bVar39 = (byte)(uVar51 >> 0x30);
        bVar90 = (byte)(uVar59 >> 0x30);
        bVar45 = (byte)(uVar59 >> 0x38);
        bVar40 = (byte)(uVar51 >> 0x38);
        auVar69[0] = -((byte)((bVar33 < bVar68) * bVar33 | (bVar33 >= bVar68) * bVar68) == bVar68);
        auVar69[1] = -((byte)((bVar34 < bVar85) * bVar34 | (bVar34 >= bVar85) * bVar85) == bVar85);
        auVar69[2] = -((byte)((bVar35 < bVar86) * bVar35 | (bVar35 >= bVar86) * bVar86) == bVar86);
        auVar69[3] = -((byte)((bVar36 < bVar87) * bVar36 | (bVar36 >= bVar87) * bVar87) == bVar87);
        auVar69[4] = -((byte)((bVar37 < bVar88) * bVar37 | (bVar37 >= bVar88) * bVar88) == bVar88);
        auVar69[5] = -((byte)((bVar38 < bVar89) * bVar38 | (bVar38 >= bVar89) * bVar89) == bVar89);
        auVar69[6] = -((byte)((bVar39 < bVar90) * bVar39 | (bVar39 >= bVar90) * bVar90) == bVar90);
        auVar69[7] = -((byte)((bVar40 < bVar45) * bVar40 | (bVar40 >= bVar45) * bVar45) == bVar45);
        auVar69[8] = 0xff;
        auVar69[9] = 0xff;
        auVar69[10] = 0xff;
        auVar69[0xb] = 0xff;
        auVar69[0xc] = 0xff;
        auVar69[0xd] = 0xff;
        auVar69[0xe] = 0xff;
        auVar69[0xf] = 0xff;
        auVar92 = pmovzxbd(auVar94,auVar94);
        fVar200 = *(float *)(uVar49 + 0x38 + lVar60);
        fVar180 = *(float *)(uVar49 + 0x3c + lVar60);
        fVar202 = *(float *)(uVar49 + 0x40 + lVar60);
        fVar91 = *(float *)(uVar49 + 0x44 + lVar60);
        fVar183 = (float)auVar92._0_4_ * fVar91 + fVar200;
        fVar189 = (float)auVar92._4_4_ * fVar91 + fVar200;
        fVar194 = (float)auVar92._8_4_ * fVar91 + fVar200;
        fVar199 = (float)auVar92._12_4_ * fVar91 + fVar200;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = *(ulong *)(uVar49 + 0x50 + lVar60);
        auVar92 = pmovzxbd(auVar95,auVar95);
        fVar151 = *(float *)(uVar49 + 0x74 + lVar60);
        fVar161 = *(float *)(uVar49 + 0x68 + lVar60);
        auVar114 = pmovzxbd(auVar130,auVar130);
        fVar184 = (float)auVar114._0_4_ * fVar91 + fVar200;
        fVar190 = (float)auVar114._4_4_ * fVar91 + fVar200;
        fVar195 = (float)auVar114._8_4_ * fVar91 + fVar200;
        fVar200 = (float)auVar114._12_4_ * fVar91 + fVar200;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)(uVar49 + 0x54 + lVar60);
        auVar114 = pmovzxbd(auVar131,auVar131);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = *(ulong *)(uVar49 + 0x28 + lVar60);
        auVar129 = pmovzxbd(auVar143,auVar143);
        fVar91 = *(float *)(uVar49 + 0x48 + lVar60);
        fVar165 = (float)auVar129._0_4_ * fVar91 + fVar180;
        fVar174 = (float)auVar129._4_4_ * fVar91 + fVar180;
        fVar176 = (float)auVar129._8_4_ * fVar91 + fVar180;
        fVar179 = (float)auVar129._12_4_ * fVar91 + fVar180;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = *(ulong *)(uVar49 + 0x58 + lVar60);
        auVar145 = pmovzxbd(auVar144,auVar144);
        fVar178 = *(float *)(uVar49 + 0x78 + lVar60);
        fVar181 = *(float *)(uVar49 + 0x6c + lVar60);
        auVar168._8_8_ = 0;
        auVar168._0_8_ = *(ulong *)(uVar49 + 0x2c + lVar60);
        auVar129 = pmovzxbd(auVar168,auVar168);
        fVar166 = (float)auVar129._0_4_ * fVar91 + fVar180;
        fVar175 = (float)auVar129._4_4_ * fVar91 + fVar180;
        fVar177 = (float)auVar129._8_4_ * fVar91 + fVar180;
        fVar180 = (float)auVar129._12_4_ * fVar91 + fVar180;
        auVar154._8_8_ = 0;
        auVar154._0_8_ = *(ulong *)(uVar49 + 0x5c + lVar60);
        auVar155 = pmovzxbd(auVar154,auVar154);
        auVar169._8_8_ = 0;
        auVar169._0_8_ = *(ulong *)(uVar49 + 0x30 + lVar60);
        auVar129 = pmovzxbd(auVar169,auVar169);
        fVar91 = *(float *)(uVar49 + 0x4c + lVar60);
        fVar185 = (float)auVar129._0_4_ * fVar91 + fVar202;
        fVar191 = (float)auVar129._4_4_ * fVar91 + fVar202;
        fVar196 = (float)auVar129._8_4_ * fVar91 + fVar202;
        fVar201 = (float)auVar129._12_4_ * fVar91 + fVar202;
        auVar170._8_8_ = 0;
        auVar170._0_8_ = *(ulong *)(uVar49 + 0x60 + lVar60);
        auVar171 = pmovzxbd(auVar170,auVar170);
        fVar124 = *(float *)(uVar49 + 0x7c + lVar60);
        fVar126 = *(float *)(uVar49 + 0x70 + lVar60);
        auVar187._8_8_ = 0;
        auVar187._0_8_ = *(ulong *)(uVar49 + 0x34 + lVar60);
        auVar129 = pmovzxbd(auVar187,auVar187);
        fVar186 = (float)auVar129._0_4_ * fVar91 + fVar202;
        fVar192 = (float)auVar129._4_4_ * fVar91 + fVar202;
        fVar197 = (float)auVar129._8_4_ * fVar91 + fVar202;
        fVar202 = (float)auVar129._12_4_ * fVar91 + fVar202;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)(uVar49 + 100 + lVar60);
        auVar129 = pmovzxbd(auVar135,auVar135);
        fVar91 = (((((float)auVar92._0_4_ * fVar151 + fVar161) - fVar183) * fVar112 + fVar183) -
                 local_8e8) * fVar208;
        fVar183 = (((((float)auVar92._4_4_ * fVar151 + fVar161) - fVar189) * fVar112 + fVar189) -
                  fStack_8e4) * fVar208;
        fVar189 = (((((float)auVar92._8_4_ * fVar151 + fVar161) - fVar194) * fVar112 + fVar194) -
                  fStack_8e0) * fVar208;
        fVar194 = (((((float)auVar92._12_4_ * fVar151 + fVar161) - fVar199) * fVar112 + fVar199) -
                  fStack_8dc) * fVar208;
        fVar199 = (((((float)auVar145._0_4_ * fVar178 + fVar181) - fVar165) * fVar112 + fVar165) -
                  local_8f8) * fVar216;
        fVar149 = (((((float)auVar145._4_4_ * fVar178 + fVar181) - fVar174) * fVar112 + fVar174) -
                  fStack_8f4) * fVar216;
        fVar150 = (((((float)auVar145._8_4_ * fVar178 + fVar181) - fVar176) * fVar112 + fVar176) -
                  fStack_8f0) * fVar216;
        fVar179 = (((((float)auVar145._12_4_ * fVar178 + fVar181) - fVar179) * fVar112 + fVar179) -
                  fStack_8ec) * fVar216;
        fVar165 = (((((float)auVar114._0_4_ * fVar151 + fVar161) - fVar184) * fVar112 + fVar184) -
                  local_8e8) * local_918;
        fVar174 = (((((float)auVar114._4_4_ * fVar151 + fVar161) - fVar190) * fVar112 + fVar190) -
                  fStack_8e4) * fStack_914;
        fVar176 = (((((float)auVar114._8_4_ * fVar151 + fVar161) - fVar195) * fVar112 + fVar195) -
                  fStack_8e0) * fStack_910;
        fVar200 = (((((float)auVar114._12_4_ * fVar151 + fVar161) - fVar200) * fVar112 + fVar200) -
                  fStack_8dc) * fStack_90c;
        fVar151 = (((((float)auVar155._0_4_ * fVar178 + fVar181) - fVar166) * fVar112 + fVar166) -
                  local_8f8) * fVar182;
        fVar161 = (((((float)auVar155._4_4_ * fVar178 + fVar181) - fVar175) * fVar112 + fVar175) -
                  fStack_8f4) * fVar182;
        fVar166 = (((((float)auVar155._8_4_ * fVar178 + fVar181) - fVar177) * fVar112 + fVar177) -
                  fStack_8f0) * fVar182;
        fVar180 = (((((float)auVar155._12_4_ * fVar178 + fVar181) - fVar180) * fVar112 + fVar180) -
                  fStack_8ec) * fVar182;
        uVar113 = (uint)((int)fVar165 < (int)fVar91) * (int)fVar165 |
                  (uint)((int)fVar165 >= (int)fVar91) * (int)fVar91;
        uVar123 = (uint)((int)fVar174 < (int)fVar183) * (int)fVar174 |
                  (uint)((int)fVar174 >= (int)fVar183) * (int)fVar183;
        uVar125 = (uint)((int)fVar176 < (int)fVar189) * (int)fVar176 |
                  (uint)((int)fVar176 >= (int)fVar189) * (int)fVar189;
        uVar127 = (uint)((int)fVar200 < (int)fVar194) * (int)fVar200 |
                  (uint)((int)fVar200 >= (int)fVar194) * (int)fVar194;
        uVar128 = (uint)((int)fVar165 < (int)fVar91) * (int)fVar91 |
                  (uint)((int)fVar165 >= (int)fVar91) * (int)fVar165;
        uVar132 = (uint)((int)fVar174 < (int)fVar183) * (int)fVar183 |
                  (uint)((int)fVar174 >= (int)fVar183) * (int)fVar174;
        uVar133 = (uint)((int)fVar176 < (int)fVar189) * (int)fVar189 |
                  (uint)((int)fVar176 >= (int)fVar189) * (int)fVar176;
        uVar134 = (uint)((int)fVar200 < (int)fVar194) * (int)fVar194 |
                  (uint)((int)fVar200 >= (int)fVar194) * (int)fVar200;
        uVar54 = (uint)((int)fVar151 < (int)fVar199) * (int)fVar151 |
                 (uint)((int)fVar151 >= (int)fVar199) * (int)fVar199;
        uVar109 = (uint)((int)fVar161 < (int)fVar149) * (int)fVar161 |
                  (uint)((int)fVar161 >= (int)fVar149) * (int)fVar149;
        uVar110 = (uint)((int)fVar166 < (int)fVar150) * (int)fVar166 |
                  (uint)((int)fVar166 >= (int)fVar150) * (int)fVar150;
        uVar111 = (uint)((int)fVar180 < (int)fVar179) * (int)fVar180 |
                  (uint)((int)fVar180 >= (int)fVar179) * (int)fVar179;
        uVar54 = ((int)uVar54 < (int)uVar113) * uVar113 | ((int)uVar54 >= (int)uVar113) * uVar54;
        uVar109 = ((int)uVar109 < (int)uVar123) * uVar123 | ((int)uVar109 >= (int)uVar123) * uVar109
        ;
        uVar110 = ((int)uVar110 < (int)uVar125) * uVar125 | ((int)uVar110 >= (int)uVar125) * uVar110
        ;
        uVar111 = ((int)uVar111 < (int)uVar127) * uVar127 | ((int)uVar111 >= (int)uVar127) * uVar111
        ;
        uVar113 = (uint)((int)fVar151 < (int)fVar199) * (int)fVar199 |
                  (uint)((int)fVar151 >= (int)fVar199) * (int)fVar151;
        uVar123 = (uint)((int)fVar161 < (int)fVar149) * (int)fVar149 |
                  (uint)((int)fVar161 >= (int)fVar149) * (int)fVar161;
        uVar125 = (uint)((int)fVar166 < (int)fVar150) * (int)fVar150 |
                  (uint)((int)fVar166 >= (int)fVar150) * (int)fVar166;
        uVar127 = (uint)((int)fVar180 < (int)fVar179) * (int)fVar179 |
                  (uint)((int)fVar180 >= (int)fVar179) * (int)fVar180;
        fVar151 = (((((float)auVar171._0_4_ * fVar124 + fVar126) - fVar185) * fVar112 + fVar185) -
                  local_908) * fVar204;
        fVar161 = (((((float)auVar171._4_4_ * fVar124 + fVar126) - fVar191) * fVar112 + fVar191) -
                  fStack_904) * fVar204;
        fVar178 = (((((float)auVar171._8_4_ * fVar124 + fVar126) - fVar196) * fVar112 + fVar196) -
                  fStack_900) * fVar204;
        fVar181 = (((((float)auVar171._12_4_ * fVar124 + fVar126) - fVar201) * fVar112 + fVar201) -
                  fStack_8fc) * fVar204;
        fVar200 = (((((float)auVar129._0_4_ * fVar124 + fVar126) - fVar186) * fVar112 + fVar186) -
                  local_908) * fVar142;
        fVar180 = (((((float)auVar129._4_4_ * fVar124 + fVar126) - fVar192) * fVar112 + fVar192) -
                  fStack_904) * fVar142;
        fVar91 = (((((float)auVar129._8_4_ * fVar124 + fVar126) - fVar197) * fVar112 + fVar197) -
                 fStack_900) * fVar142;
        fVar202 = (((((float)auVar129._12_4_ * fVar124 + fVar126) - fVar202) * fVar112 + fVar202) -
                  fStack_8fc) * fVar142;
        uVar152 = ((int)uVar128 < (int)uVar113) * uVar128 | ((int)uVar128 >= (int)uVar113) * uVar113
        ;
        uVar162 = ((int)uVar132 < (int)uVar123) * uVar132 | ((int)uVar132 >= (int)uVar123) * uVar123
        ;
        uVar163 = ((int)uVar133 < (int)uVar125) * uVar133 | ((int)uVar133 >= (int)uVar125) * uVar125
        ;
        uVar164 = ((int)uVar134 < (int)uVar127) * uVar134 | ((int)uVar134 >= (int)uVar127) * uVar127
        ;
        uVar113 = (uint)((int)fVar200 < (int)fVar151) * (int)fVar200 |
                  (uint)((int)fVar200 >= (int)fVar151) * (int)fVar151;
        uVar123 = (uint)((int)fVar180 < (int)fVar161) * (int)fVar180 |
                  (uint)((int)fVar180 >= (int)fVar161) * (int)fVar161;
        uVar125 = (uint)((int)fVar91 < (int)fVar178) * (int)fVar91 |
                  (uint)((int)fVar91 >= (int)fVar178) * (int)fVar178;
        uVar127 = (uint)((int)fVar202 < (int)fVar181) * (int)fVar202 |
                  (uint)((int)fVar202 >= (int)fVar181) * (int)fVar181;
        uVar128 = (uint)((int)fVar200 < (int)fVar151) * (int)fVar151 |
                  (uint)((int)fVar200 >= (int)fVar151) * (int)fVar200;
        uVar132 = (uint)((int)fVar180 < (int)fVar161) * (int)fVar161 |
                  (uint)((int)fVar180 >= (int)fVar161) * (int)fVar180;
        uVar133 = (uint)((int)fVar91 < (int)fVar178) * (int)fVar178 |
                  (uint)((int)fVar91 >= (int)fVar178) * (int)fVar91;
        uVar134 = (uint)((int)fVar202 < (int)fVar181) * (int)fVar181 |
                  (uint)((int)fVar202 >= (int)fVar181) * (int)fVar202;
        iVar48 = bi_2.field_0._0_4_;
        uVar113 = (uint)((int)uVar113 < iVar48) * iVar48 | ((int)uVar113 >= iVar48) * uVar113;
        iVar48 = bi_2.field_0._4_4_;
        uVar123 = (uint)((int)uVar123 < iVar48) * iVar48 | ((int)uVar123 >= iVar48) * uVar123;
        iVar48 = bi_2.field_0._8_4_;
        uVar125 = (uint)((int)uVar125 < iVar48) * iVar48 | ((int)uVar125 >= iVar48) * uVar125;
        iVar48 = bi_2.field_0._12_4_;
        uVar127 = (uint)((int)uVar127 < iVar48) * iVar48 | ((int)uVar127 >= iVar48) * uVar127;
        uVar128 = (uint)(iVar18 < (int)uVar128) * iVar18 | (iVar18 >= (int)uVar128) * uVar128;
        uVar132 = (uint)(iVar18 < (int)uVar132) * iVar18 | (iVar18 >= (int)uVar132) * uVar132;
        uVar133 = (uint)(iVar18 < (int)uVar133) * iVar18 | (iVar18 >= (int)uVar133) * uVar133;
        uVar134 = (uint)(iVar18 < (int)uVar134) * iVar18 | (iVar18 >= (int)uVar134) * uVar134;
        auVar115._0_4_ =
             -(uint)((int)(((int)uVar152 < (int)uVar128) * uVar152 |
                          ((int)uVar152 >= (int)uVar128) * uVar128) <
                    (int)(((int)uVar113 < (int)uVar54) * uVar54 |
                         ((int)uVar113 >= (int)uVar54) * uVar113));
        auVar115._4_4_ =
             -(uint)((int)(((int)uVar162 < (int)uVar132) * uVar162 |
                          ((int)uVar162 >= (int)uVar132) * uVar132) <
                    (int)(((int)uVar123 < (int)uVar109) * uVar109 |
                         ((int)uVar123 >= (int)uVar109) * uVar123));
        auVar115._8_4_ =
             -(uint)((int)(((int)uVar163 < (int)uVar133) * uVar163 |
                          ((int)uVar163 >= (int)uVar133) * uVar133) <
                    (int)(((int)uVar125 < (int)uVar110) * uVar110 |
                         ((int)uVar125 >= (int)uVar110) * uVar125));
        auVar115._12_4_ =
             -(uint)((int)(((int)uVar164 < (int)uVar134) * uVar164 |
                          ((int)uVar164 >= (int)uVar134) * uVar134) <
                    (int)(((int)uVar127 < (int)uVar111) * uVar111 |
                         ((int)uVar127 >= (int)uVar111) * uVar127));
        auVar92 = pmovsxbd(auVar69,auVar69);
        uVar54 = movmskps((int)sVar53,~auVar115 & auVar92);
        if (uVar54 != 0) {
          lVar60 = lVar60 + uVar49;
          uVar59 = (ulong)(uVar54 & 0xff);
          do {
            lVar28 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
              }
            }
            uVar21 = *(ushort *)(lVar60 + lVar28 * 8);
            uVar22 = *(ushort *)(lVar60 + 2 + lVar28 * 8);
            uVar54 = *(uint *)(lVar60 + 0x88);
            uVar58 = CONCAT44(0,uVar54);
            uVar109 = *(uint *)(lVar60 + 4 + lVar28 * 8);
            _old_t_1 = uVar58;
            pGVar52 = (context->scene->geometries).items[uVar58].ptr;
            local_c30 = *(long *)&pGVar52->field_0x58;
            local_c38 = (ulong)uVar109 *
                        pGVar52[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
            ;
            fVar200 = pGVar52->fnumTimeSegments;
            fVar180 = (pGVar52->time_range).lower;
            auVar116._0_4_ = (pGVar52->time_range).upper - fVar180;
            auVar96._4_4_ = fVar180;
            auVar96._0_4_ = fVar180;
            auVar96._8_4_ = fVar180;
            auVar96._12_4_ = fVar180;
            auVar136._0_4_ = *(float *)(ray + 0x70) - fVar180;
            auVar136._4_4_ = *(float *)(ray + 0x74) - fVar180;
            auVar136._8_4_ = *(float *)(ray + 0x78) - fVar180;
            auVar136._12_4_ = *(float *)(ray + 0x7c) - fVar180;
            auVar116._4_4_ = auVar116._0_4_;
            auVar116._8_4_ = auVar116._0_4_;
            auVar116._12_4_ = auVar116._0_4_;
            auVar92 = divps(auVar136,auVar116);
            auVar137._0_4_ = auVar92._0_4_ * fVar200;
            auVar137._4_4_ = auVar92._4_4_ * fVar200;
            auVar137._8_4_ = auVar92._8_4_ * fVar200;
            auVar137._12_4_ = auVar92._12_4_ * fVar200;
            auVar92 = roundps(auVar96,auVar137,1);
            auVar70._0_4_ = fVar200 + -1.0;
            auVar70._4_4_ = auVar70._0_4_;
            auVar70._8_4_ = auVar70._0_4_;
            auVar70._12_4_ = auVar70._0_4_;
            auVar92 = minps(auVar92,auVar70);
            auVar92 = maxps(auVar92,_DAT_01f7aa10);
            ftime.field_0.v[0] = auVar137._0_4_ - auVar92._0_4_;
            ftime.field_0.v[1] = auVar137._4_4_ - auVar92._4_4_;
            ftime.field_0.v[2] = auVar137._8_4_ - auVar92._8_4_;
            ftime.field_0.v[3] = auVar137._12_4_ - auVar92._12_4_;
            itime.field_0.i[0] = (int)auVar92._0_4_;
            itime.field_0.i[1] = (int)auVar92._4_4_;
            itime.field_0.i[2] = (int)auVar92._8_4_;
            itime.field_0.i[3] = (int)auVar92._12_4_;
            uVar111 = uVar21 & 0x7fff;
            uVar110 = *(uint *)(local_c30 + 4 + local_c38);
            uVar63 = (ulong)uVar110;
            uVar56 = (ulong)(uVar110 * (uVar22 & 0x7fff) + *(int *)(local_c30 + local_c38) + uVar111
                            );
            lVar28 = *(long *)&pGVar52[2].numPrimitives;
            lVar61 = (long)itime.field_0.i[k] * 0x38;
            lVar23 = *(long *)(lVar28 + 0x10 + lVar61);
            lVar24 = *(long *)(lVar28 + lVar61);
            pfVar16 = (float *)(lVar24 + lVar23 * uVar56);
            lVar25 = *(long *)(lVar28 + 0x38 + lVar61);
            lVar61 = *(long *)(lVar28 + 0x48 + lVar61);
            pfVar17 = (float *)(lVar25 + lVar61 * uVar56);
            pfVar1 = (float *)(lVar24 + (uVar56 + 1) * lVar23);
            pfVar2 = (float *)(lVar25 + lVar61 * (uVar56 + 1));
            lVar28 = uVar56 + uVar63;
            pfVar3 = (float *)(lVar24 + lVar28 * lVar23);
            pfVar4 = (float *)(lVar25 + lVar61 * lVar28);
            lVar50 = uVar56 + uVar63 + 1;
            pfVar5 = (float *)(lVar24 + lVar50 * lVar23);
            pfVar6 = (float *)(lVar25 + lVar61 * lVar50);
            uVar51 = (ulong)(-1 < (short)uVar21);
            lVar57 = uVar56 + uVar51 + 1;
            pfVar7 = (float *)(lVar24 + lVar57 * lVar23);
            pfVar8 = (float *)(lVar25 + lVar61 * lVar57);
            lVar57 = uVar51 + lVar50;
            pfVar9 = (float *)(lVar24 + lVar57 * lVar23);
            pfVar10 = (float *)(lVar25 + lVar61 * lVar57);
            uVar51 = 0;
            if (-1 < (short)uVar22) {
              uVar51 = uVar63;
            }
            pfVar11 = (float *)(lVar24 + (lVar28 + uVar51) * lVar23);
            pfVar12 = (float *)(lVar25 + lVar61 * (lVar28 + uVar51));
            pfVar13 = (float *)(lVar24 + (lVar50 + uVar51) * lVar23);
            local_8c8 = *(float *)((long)&stack[-2].ptr + k * 4);
            pfVar14 = (float *)(lVar25 + lVar61 * (lVar50 + uVar51));
            fVar189 = (*pfVar2 - *pfVar1) * local_8c8 + *pfVar1;
            local_938 = (pfVar2[1] - pfVar1[1]) * local_8c8 + pfVar1[1];
            fVar199 = (pfVar2[2] - pfVar1[2]) * local_8c8 + pfVar1[2];
            fVar91 = (*pfVar4 - *pfVar3) * local_8c8 + *pfVar3;
            local_948 = (pfVar4[1] - pfVar3[1]) * local_8c8 + pfVar3[1];
            local_928 = (pfVar4[2] - pfVar3[2]) * local_8c8 + pfVar3[2];
            fVar191 = (*pfVar6 - *pfVar5) * local_8c8 + *pfVar5;
            fVar195 = (pfVar6[1] - pfVar5[1]) * local_8c8 + pfVar5[1];
            fVar192 = (pfVar6[2] - pfVar5[2]) * local_8c8 + pfVar5[2];
            fStack_934 = (pfVar8[1] - pfVar7[1]) * local_8c8 + pfVar7[1];
            fVar178 = (pfVar8[2] - pfVar7[2]) * local_8c8 + pfVar7[2];
            local_8b8 = (*pfVar10 - *pfVar9) * local_8c8 + *pfVar9;
            fStack_8b4 = (pfVar10[1] - pfVar9[1]) * local_8c8 + pfVar9[1];
            fVar201 = (pfVar10[2] - pfVar9[2]) * local_8c8 + pfVar9[2];
            fStack_894 = (*pfVar12 - *pfVar11) * local_8c8 + *pfVar11;
            fStack_93c = (pfVar12[1] - pfVar11[1]) * local_8c8 + pfVar11[1];
            fStack_91c = (pfVar12[2] - pfVar11[2]) * local_8c8 + pfVar11[2];
            fStack_8c4 = local_8c8;
            fStack_8c0 = local_8c8;
            fStack_8bc = local_8c8;
            local_8d8 = (*pfVar14 - *pfVar13) * local_8c8 + *pfVar13;
            fStack_8d4 = (pfVar14[1] - pfVar13[1]) * local_8c8 + pfVar13[1];
            fStack_8d0 = (pfVar14[2] - pfVar13[2]) * local_8c8 + pfVar13[2];
            fStack_8b0 = fVar201;
            fStack_8ac = (pfVar10[3] - pfVar9[3]) * local_8c8 + pfVar9[3];
            fStack_8cc = (pfVar14[3] - pfVar13[3]) * local_8c8 + pfVar13[3];
            fVar200 = *(float *)(ray + k * 4);
            local_808 = ((*pfVar17 - *pfVar16) * local_8c8 + *pfVar16) - fVar200;
            fStack_804 = fVar189 - fVar200;
            fStack_800 = fVar191 - fVar200;
            fStack_7fc = fVar91 - fVar200;
            fVar189 = fVar189 - fVar200;
            fVar194 = ((*pfVar8 - *pfVar7) * local_8c8 + *pfVar7) - fVar200;
            fVar112 = local_8b8 - fVar200;
            fVar165 = fVar191 - fVar200;
            local_8a8 = CONCAT44(fVar191,fVar91);
            local_898 = local_8d8;
            fVar91 = fVar91 - fVar200;
            fVar151 = fVar191 - fVar200;
            fVar161 = local_8d8 - fVar200;
            fVar200 = fStack_894 - fVar200;
            local_a58 = *(float *)(ray + k * 4 + 0x10);
            local_a68 = *(float *)(ray + k * 4 + 0x20);
            fVar174 = ((pfVar17[1] - pfVar16[1]) * local_8c8 + pfVar16[1]) - local_a58;
            fVar176 = local_938 - local_a58;
            fVar149 = fVar195 - local_a58;
            fVar150 = local_948 - local_a58;
            fVar181 = ((pfVar17[2] - pfVar16[2]) * local_8c8 + pfVar16[2]) - local_a68;
            fVar124 = fVar199 - local_a68;
            fVar126 = fVar192 - local_a68;
            fVar183 = local_928 - local_a68;
            fStack_944 = fVar195;
            fStack_940 = fStack_8d4;
            local_cb8 = local_948 - local_a58;
            fStack_cb4 = fVar195 - local_a58;
            fStack_cb0 = fStack_8d4 - local_a58;
            fStack_cac = fStack_93c - local_a58;
            fStack_924 = fVar192;
            fStack_920 = fStack_8d0;
            local_cc8._0_4_ = local_928 - local_a68;
            local_cc8._4_4_ = fVar192 - local_a68;
            fStack_cc0 = fStack_8d0 - local_a68;
            fStack_cbc = fStack_91c - local_a68;
            local_818 = fVar91 - local_808;
            fStack_814 = fVar151 - fStack_804;
            fStack_810 = fVar161 - fStack_800;
            fStack_80c = fVar200 - fStack_7fc;
            local_838 = local_cb8 - fVar174;
            fStack_834 = fStack_cb4 - fVar176;
            fStack_830 = fStack_cb0 - fVar149;
            fStack_82c = fStack_cac - fVar150;
            local_828 = (float)local_cc8 - fVar181;
            fStack_824 = local_cc8._4_4_ - fVar124;
            fStack_820 = fStack_cc0 - fVar126;
            fStack_81c = fStack_cbc - fVar183;
            fVar180 = *(float *)(ray + k * 4 + 0x50);
            fVar202 = *(float *)(ray + k * 4 + 0x60);
            fStack_d04 = *(float *)(ray + k * 4 + 0x40);
            fVar231 = (local_838 * ((float)local_cc8 + fVar181) - (local_cb8 + fVar174) * local_828)
                      * fStack_d04 +
                      ((fVar91 + local_808) * local_828 - ((float)local_cc8 + fVar181) * local_818)
                      * fVar180 +
                      (local_818 * (local_cb8 + fVar174) - (fVar91 + local_808) * local_838) *
                      fVar202;
            fVar233 = (fStack_834 * (local_cc8._4_4_ + fVar124) -
                      (fStack_cb4 + fVar176) * fStack_824) * fStack_d04 +
                      ((fVar151 + fStack_804) * fStack_824 -
                      (local_cc8._4_4_ + fVar124) * fStack_814) * fVar180 +
                      (fStack_814 * (fStack_cb4 + fVar176) - (fVar151 + fStack_804) * fStack_834) *
                      fVar202;
            fVar235 = (fStack_830 * (fStack_cc0 + fVar126) - (fStack_cb0 + fVar149) * fStack_820) *
                      fStack_d04 +
                      ((fVar161 + fStack_800) * fStack_820 - (fStack_cc0 + fVar126) * fStack_810) *
                      fVar180 + (fStack_810 * (fStack_cb0 + fVar149) -
                                (fVar161 + fStack_800) * fStack_830) * fVar202;
            fVar237 = (fStack_82c * (fStack_cbc + fVar183) - (fStack_cac + fVar150) * fStack_81c) *
                      fStack_d04 +
                      ((fVar200 + fStack_7fc) * fStack_81c - (fStack_cbc + fVar183) * fStack_80c) *
                      fVar180 + (fStack_80c * (fStack_cac + fVar150) -
                                (fVar200 + fStack_7fc) * fStack_82c) * fVar202;
            fStack_930 = fStack_8b4;
            fStack_92c = fVar195;
            fStack_a54 = local_a58;
            fStack_a50 = local_a58;
            fStack_a4c = local_a58;
            local_aa8 = local_938 - local_a58;
            fStack_aa4 = fStack_934 - local_a58;
            fStack_aa0 = fStack_8b4 - local_a58;
            fStack_a9c = fVar195 - local_a58;
            fStack_a64 = local_a68;
            fStack_a60 = local_a68;
            fStack_a5c = local_a68;
            local_a98 = fVar199 - local_a68;
            fStack_a94 = fVar178 - local_a68;
            fStack_a90 = fStack_be0 - local_a68;
            fStack_a8c = fStack_bdc - local_a68;
            local_858 = local_808 - fVar189;
            fStack_854 = fStack_804 - fVar194;
            fStack_850 = fStack_800 - fVar112;
            fStack_84c = fStack_7fc - fVar165;
            fVar184 = fVar174 - local_aa8;
            fVar185 = fVar176 - fStack_aa4;
            fVar186 = fVar149 - fStack_aa0;
            fVar190 = fVar150 - fStack_a9c;
            local_848 = fVar181 - local_a98;
            fStack_844 = fVar124 - fStack_a94;
            fStack_840 = fVar126 - fStack_a90;
            fStack_83c = fVar183 - fStack_a8c;
            local_878._0_8_ = CONCAT44(fVar233,fVar231);
            local_878._8_4_ = fVar235;
            local_878._12_4_ = fVar237;
            local_888 = (fVar184 * (fVar181 + local_a98) - (fVar174 + local_aa8) * local_848) *
                        fStack_d04 +
                        ((local_808 + fVar189) * local_848 - (fVar181 + local_a98) * local_858) *
                        fVar180 + (local_858 * (fVar174 + local_aa8) -
                                  (local_808 + fVar189) * fVar184) * fVar202;
            fStack_884 = (fVar185 * (fVar124 + fStack_a94) - (fVar176 + fStack_aa4) * fStack_844) *
                         fStack_d04 +
                         ((fStack_804 + fVar194) * fStack_844 - (fVar124 + fStack_a94) * fStack_854)
                         * fVar180 +
                         (fStack_854 * (fVar176 + fStack_aa4) - (fStack_804 + fVar194) * fVar185) *
                         fVar202;
            fStack_880 = (fVar186 * (fVar126 + fStack_a90) - (fVar149 + fStack_aa0) * fStack_840) *
                         fStack_d04 +
                         ((fStack_800 + fVar112) * fStack_840 - (fVar126 + fStack_a90) * fStack_850)
                         * fVar180 +
                         (fStack_850 * (fVar149 + fStack_aa0) - (fStack_800 + fVar112) * fVar186) *
                         fVar202;
            fStack_87c = (fVar190 * (fVar183 + fStack_a8c) - (fVar150 + fStack_a9c) * fStack_83c) *
                         fStack_d04 +
                         ((fStack_7fc + fVar165) * fStack_83c - (fVar183 + fStack_a8c) * fStack_84c)
                         * fVar180 +
                         (fStack_84c * (fVar150 + fStack_a9c) - (fStack_7fc + fVar165) * fVar190) *
                         fVar202;
            fVar196 = fVar189 - fVar91;
            fVar197 = fVar194 - fVar151;
            fVar220 = fVar112 - fVar161;
            fVar222 = fVar165 - fVar200;
            fVar179 = local_aa8 - local_cb8;
            fVar166 = fStack_aa4 - fStack_cb4;
            fVar175 = fStack_aa0 - fStack_cb0;
            fVar177 = fStack_a9c - fStack_cac;
            auVar146._0_4_ = local_a98 - (float)local_cc8;
            auVar146._4_4_ = fStack_a94 - local_cc8._4_4_;
            auVar146._8_4_ = fStack_a90 - fStack_cc0;
            auVar146._12_4_ = fStack_a8c - fStack_cbc;
            local_a88 = local_aa8 + local_cb8;
            fStack_a84 = fStack_aa4 + fStack_cb4;
            fStack_a80 = fStack_aa0 + fStack_cb0;
            fStack_a7c = fStack_a9c + fStack_cac;
            local_a78 = local_a98 + (float)local_cc8;
            fStack_a74 = fStack_a94 + local_cc8._4_4_;
            fStack_a70 = fStack_a90 + fStack_cc0;
            fStack_a6c = fStack_a8c + fStack_cbc;
            auVar97._0_4_ =
                 (fVar179 * local_a78 - local_a88 * auVar146._0_4_) * fStack_d04 +
                 ((fVar91 + fVar189) * auVar146._0_4_ - fVar196 * local_a78) * fVar180 +
                 (fVar196 * local_a88 - (fVar91 + fVar189) * fVar179) * fVar202;
            auVar97._4_4_ =
                 (fVar166 * fStack_a74 - fStack_a84 * auVar146._4_4_) * fStack_d04 +
                 ((fVar151 + fVar194) * auVar146._4_4_ - fVar197 * fStack_a74) * fVar180 +
                 (fVar197 * fStack_a84 - (fVar151 + fVar194) * fVar166) * fVar202;
            auVar97._8_4_ =
                 (fVar175 * fStack_a70 - fStack_a80 * auVar146._8_4_) * fStack_d04 +
                 ((fVar161 + fVar112) * auVar146._8_4_ - fVar220 * fStack_a70) * fVar180 +
                 (fVar220 * fStack_a80 - (fVar161 + fVar112) * fVar175) * fVar202;
            auVar97._12_4_ =
                 (fVar177 * fStack_a6c - fStack_a7c * auVar146._12_4_) * fStack_d04 +
                 ((fVar200 + fVar165) * auVar146._12_4_ - fVar222 * fStack_a6c) * fVar180 +
                 (fVar222 * fStack_a7c - (fVar200 + fVar165) * fVar177) * fVar202;
            local_868 = fVar231 + local_888 + auVar97._0_4_;
            fStack_864 = fVar233 + fStack_884 + auVar97._4_4_;
            fStack_860 = fVar235 + fStack_880 + auVar97._8_4_;
            fStack_85c = fVar237 + fStack_87c + auVar97._12_4_;
            auVar71._8_4_ = fVar235;
            auVar71._0_8_ = local_878._0_8_;
            auVar71._12_4_ = fVar237;
            auVar42._4_4_ = fStack_884;
            auVar42._0_4_ = local_888;
            auVar42._8_4_ = fStack_880;
            auVar42._12_4_ = fStack_87c;
            auVar92 = minps(auVar71,auVar42);
            auVar92 = minps(auVar92,auVar97);
            auVar225._8_4_ = fVar235;
            auVar225._0_8_ = local_878._0_8_;
            auVar225._12_4_ = fVar237;
            auVar43._4_4_ = fStack_884;
            auVar43._0_4_ = local_888;
            auVar43._8_4_ = fStack_880;
            auVar43._12_4_ = fStack_87c;
            auVar114 = maxps(auVar225,auVar43);
            auVar114 = maxps(auVar114,auVar97);
            fVar200 = ABS(local_868) * 1.1920929e-07;
            fVar91 = ABS(fStack_864) * 1.1920929e-07;
            fVar151 = ABS(fStack_860) * 1.1920929e-07;
            fVar161 = ABS(fStack_85c) * 1.1920929e-07;
            auVar226._4_4_ = -(uint)(auVar114._4_4_ <= fVar91);
            auVar226._0_4_ = -(uint)(auVar114._0_4_ <= fVar200);
            auVar226._8_4_ = -(uint)(auVar114._8_4_ <= fVar151);
            auVar226._12_4_ = -(uint)(auVar114._12_4_ <= fVar161);
            auVar72._4_4_ = -(uint)(-fVar91 <= auVar92._4_4_);
            auVar72._0_4_ = -(uint)(-fVar200 <= auVar92._0_4_);
            auVar72._8_4_ = -(uint)(-fVar151 <= auVar92._8_4_);
            auVar72._12_4_ = -(uint)(-fVar161 <= auVar92._12_4_);
            auVar226 = auVar226 | auVar72;
            lVar61 = (uVar51 + lVar57) * lVar61;
            uVar110 = movmskps((int)lVar61,auVar226);
            pGVar52 = (Geometry *)(ulong)uVar110;
            puVar15 = (undefined8 *)(lVar24 + lVar23 * (uVar51 + lVar57));
            local_c68 = *puVar15;
            uStack_c60 = puVar15[1];
            puVar15 = (undefined8 *)(lVar25 + lVar61);
            local_c78 = *puVar15;
            uStack_c70 = puVar15[1];
            if (uVar110 != 0) {
              auVar210._0_4_ = fVar184 * auVar146._0_4_ - fVar179 * local_848;
              auVar210._4_4_ = fVar185 * auVar146._4_4_ - fVar166 * fStack_844;
              auVar210._8_4_ = fVar186 * auVar146._8_4_ - fVar175 * fStack_840;
              auVar210._12_4_ = fVar190 * auVar146._12_4_ - fVar177 * fStack_83c;
              auVar73._4_4_ = -(uint)(ABS(fVar185 * fStack_824) < ABS(fVar166 * fStack_844));
              auVar73._0_4_ = -(uint)(ABS(fVar184 * local_828) < ABS(fVar179 * local_848));
              auVar73._8_4_ = -(uint)(ABS(fVar186 * fStack_820) < ABS(fVar175 * fStack_840));
              auVar73._12_4_ = -(uint)(ABS(fVar190 * fStack_81c) < ABS(fVar177 * fStack_83c));
              auVar41._4_4_ = fStack_834 * fStack_844 - fVar185 * fStack_824;
              auVar41._0_4_ = local_838 * local_848 - fVar184 * local_828;
              auVar41._8_4_ = fStack_830 * fStack_840 - fVar186 * fStack_820;
              auVar41._12_4_ = fStack_82c * fStack_83c - fVar190 * fStack_81c;
              local_ad8 = blendvps(auVar210,auVar41,auVar73);
              auVar188._0_4_ = local_828 * local_858 - local_818 * local_848;
              auVar188._4_4_ = fStack_824 * fStack_854 - fStack_814 * fStack_844;
              auVar188._8_4_ = fStack_820 * fStack_850 - fStack_810 * fStack_840;
              auVar188._12_4_ = fStack_81c * fStack_84c - fStack_80c * fStack_83c;
              auVar217._0_4_ = fVar196 * local_848 - local_858 * auVar146._0_4_;
              auVar217._4_4_ = fVar197 * fStack_844 - fStack_854 * auVar146._4_4_;
              auVar217._8_4_ = fVar220 * fStack_840 - fStack_850 * auVar146._8_4_;
              auVar217._12_4_ = fVar222 * fStack_83c - fStack_84c * auVar146._12_4_;
              auVar74._4_4_ =
                   -(uint)(ABS(fStack_814 * fStack_844) < ABS(fStack_854 * auVar146._4_4_));
              auVar74._0_4_ = -(uint)(ABS(local_818 * local_848) < ABS(local_858 * auVar146._0_4_));
              auVar74._8_4_ =
                   -(uint)(ABS(fStack_810 * fStack_840) < ABS(fStack_850 * auVar146._8_4_));
              auVar74._12_4_ =
                   -(uint)(ABS(fStack_80c * fStack_83c) < ABS(fStack_84c * auVar146._12_4_));
              local_ac8 = blendvps(auVar217,auVar188,auVar74);
              auVar138._0_4_ = local_818 * fVar184 - local_858 * local_838;
              auVar138._4_4_ = fStack_814 * fVar185 - fStack_854 * fStack_834;
              auVar138._8_4_ = fStack_810 * fVar186 - fStack_850 * fStack_830;
              auVar138._12_4_ = fStack_80c * fVar190 - fStack_84c * fStack_82c;
              auVar172._0_4_ = local_858 * fVar179 - fVar196 * fVar184;
              auVar172._4_4_ = fStack_854 * fVar166 - fVar197 * fVar185;
              auVar172._8_4_ = fStack_850 * fVar175 - fVar220 * fVar186;
              auVar172._12_4_ = fStack_84c * fVar177 - fVar222 * fVar190;
              auVar75._4_4_ = -(uint)(ABS(fStack_854 * fStack_834) < ABS(fVar197 * fVar185));
              auVar75._0_4_ = -(uint)(ABS(local_858 * local_838) < ABS(fVar196 * fVar184));
              auVar75._8_4_ = -(uint)(ABS(fStack_850 * fStack_830) < ABS(fVar220 * fVar186));
              auVar75._12_4_ = -(uint)(ABS(fStack_84c * fStack_82c) < ABS(fVar222 * fVar190));
              local_ab8 = blendvps(auVar172,auVar138,auVar75);
              fVar200 = fStack_d04 * local_ad8._0_4_ +
                        fVar180 * local_ac8._0_4_ + fVar202 * local_ab8._0_4_;
              fVar91 = fStack_d04 * local_ad8._4_4_ +
                       fVar180 * local_ac8._4_4_ + fVar202 * local_ab8._4_4_;
              fVar151 = fStack_d04 * local_ad8._8_4_ +
                        fVar180 * local_ac8._8_4_ + fVar202 * local_ab8._8_4_;
              fVar161 = fStack_d04 * local_ad8._12_4_ +
                        fVar180 * local_ac8._12_4_ + fVar202 * local_ab8._12_4_;
              auVar76._0_4_ = fVar200 + fVar200;
              auVar76._4_4_ = fVar91 + fVar91;
              auVar76._8_4_ = fVar151 + fVar151;
              auVar76._12_4_ = fVar161 + fVar161;
              auVar117._0_4_ = fVar174 * local_ac8._0_4_ + fVar181 * local_ab8._0_4_;
              auVar117._4_4_ = fVar176 * local_ac8._4_4_ + fVar124 * local_ab8._4_4_;
              auVar117._8_4_ = fVar149 * local_ac8._8_4_ + fVar126 * local_ab8._8_4_;
              auVar117._12_4_ = fVar150 * local_ac8._12_4_ + fVar183 * local_ab8._12_4_;
              fVar181 = local_808 * local_ad8._0_4_ + auVar117._0_4_;
              fVar124 = fStack_804 * local_ad8._4_4_ + auVar117._4_4_;
              fVar126 = fStack_800 * local_ad8._8_4_ + auVar117._8_4_;
              fVar183 = fStack_7fc * local_ad8._12_4_ + auVar117._12_4_;
              auVar92 = rcpps(auVar117,auVar76);
              fVar200 = auVar92._0_4_;
              fVar91 = auVar92._4_4_;
              fVar151 = auVar92._8_4_;
              fVar161 = auVar92._12_4_;
              local_ae8._0_4_ =
                   ((1.0 - auVar76._0_4_ * fVar200) * fVar200 + fVar200) * (fVar181 + fVar181);
              local_ae8._4_4_ =
                   ((1.0 - auVar76._4_4_ * fVar91) * fVar91 + fVar91) * (fVar124 + fVar124);
              local_ae8._8_4_ =
                   ((1.0 - auVar76._8_4_ * fVar151) * fVar151 + fVar151) * (fVar126 + fVar126);
              local_ae8._12_4_ =
                   ((1.0 - auVar76._12_4_ * fVar161) * fVar161 + fVar161) * (fVar183 + fVar183);
              fVar200 = *(float *)(ray + k * 4 + 0x80);
              fVar91 = *(float *)(ray + k * 4 + 0x30);
              auVar118._0_4_ =
                   -(uint)(local_ae8._0_4_ <= fVar200 && fVar91 <= local_ae8._0_4_) & auVar226._0_4_
              ;
              auVar118._4_4_ =
                   -(uint)(local_ae8._4_4_ <= fVar200 && fVar91 <= local_ae8._4_4_) & auVar226._4_4_
              ;
              auVar118._8_4_ =
                   -(uint)(local_ae8._8_4_ <= fVar200 && fVar91 <= local_ae8._8_4_) & auVar226._8_4_
              ;
              auVar118._12_4_ =
                   -(uint)(local_ae8._12_4_ <= fVar200 && fVar91 <= local_ae8._12_4_) &
                   auVar226._12_4_;
              uVar110 = movmskps(uVar110,auVar118);
              pGVar52 = (Geometry *)(ulong)uVar110;
              if (uVar110 != 0) {
                auVar119._0_4_ = auVar118._0_4_ & -(uint)(auVar76._0_4_ != 0.0);
                auVar119._4_4_ = auVar118._4_4_ & -(uint)(auVar76._4_4_ != 0.0);
                auVar119._8_4_ = auVar118._8_4_ & -(uint)(auVar76._8_4_ != 0.0);
                auVar119._12_4_ = auVar118._12_4_ & -(uint)(auVar76._12_4_ != 0.0);
                uVar110 = movmskps(uVar110,auVar119);
                pGVar52 = (Geometry *)(ulong)uVar110;
                if (uVar110 != 0) {
                  auVar46._4_4_ = fStack_864;
                  auVar46._0_4_ = local_868;
                  auVar46._8_4_ = fStack_860;
                  auVar46._12_4_ = fStack_85c;
                  auVar98._4_12_ = local_ae8._4_12_;
                  auVar98._0_4_ = (float)(int)(*(ushort *)(local_c30 + 8 + local_c38) - 1);
                  auVar139._4_4_ = local_ae8._4_4_;
                  auVar139._0_4_ = auVar98._0_4_;
                  auVar139._8_4_ = local_ae8._8_4_;
                  auVar139._12_4_ = local_ae8._12_4_;
                  auVar92 = rcpss(auVar139,auVar98);
                  auVar147._4_12_ = auVar146._4_12_;
                  auVar147._0_4_ = (float)(int)(*(ushort *)(local_c30 + 10 + local_c38) - 1);
                  fVar91 = (2.0 - auVar98._0_4_ * auVar92._0_4_) * auVar92._0_4_;
                  auVar140._4_4_ = auVar146._4_4_;
                  auVar140._0_4_ = auVar147._0_4_;
                  auVar140._8_4_ = auVar146._8_4_;
                  auVar140._12_4_ = auVar146._12_4_;
                  auVar92 = rcpss(auVar140,auVar147);
                  fVar151 = (2.0 - auVar147._0_4_ * auVar92._0_4_) * auVar92._0_4_;
                  auVar120._0_4_ = (float)(int)fVar201 * local_868 + local_888;
                  auVar120._4_4_ = (float)(int)fVar201 * fStack_864 + fStack_884;
                  auVar120._8_4_ = (float)((int)fVar201 + 1) * fStack_860 + fStack_880;
                  auVar120._12_4_ = (float)((int)fVar201 + 1) * fStack_85c + fStack_87c;
                  pGVar26 = (context->scene->geometries).items[uVar58].ptr;
                  pGVar52 = pGVar26;
                  if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002a2970;
                    auVar92 = rcpps(auVar120,auVar46);
                    fVar180 = auVar92._0_4_;
                    fVar202 = auVar92._4_4_;
                    fVar161 = auVar92._8_4_;
                    fVar181 = auVar92._12_4_;
                    fVar180 = (float)(-(uint)(1e-18 <= ABS(local_868)) &
                                     (uint)(((float)DAT_01f7ba10 - local_868 * fVar180) * fVar180 +
                                           fVar180));
                    fVar202 = (float)(-(uint)(1e-18 <= ABS(fStack_864)) &
                                     (uint)((DAT_01f7ba10._4_4_ - fStack_864 * fVar202) * fVar202 +
                                           fVar202));
                    fVar161 = (float)(-(uint)(1e-18 <= ABS(fStack_860)) &
                                     (uint)((DAT_01f7ba10._8_4_ - fStack_860 * fVar161) * fVar161 +
                                           fVar161));
                    fVar181 = (float)(-(uint)(1e-18 <= ABS(fStack_85c)) &
                                     (uint)((DAT_01f7ba10._12_4_ - fStack_85c * fVar181) * fVar181 +
                                           fVar181));
                    auVar77._0_4_ = fVar91 * (fVar231 + (float)uVar111 * local_868) * fVar180;
                    auVar77._4_4_ = fVar91 * (fVar233 + (float)(uVar111 + 1) * fStack_864) * fVar202
                    ;
                    auVar77._8_4_ = fVar91 * (fVar235 + (float)(uVar111 + 1) * fStack_860) * fVar161
                    ;
                    auVar77._12_4_ = fVar91 * (fVar237 + (float)uVar111 * fStack_85c) * fVar181;
                    local_b08 = minps(auVar77,_DAT_01f7ba10);
                    auVar99._0_4_ = fVar151 * auVar120._0_4_ * fVar180;
                    auVar99._4_4_ = fVar151 * auVar120._4_4_ * fVar202;
                    auVar99._8_4_ = fVar151 * auVar120._8_4_ * fVar161;
                    auVar99._12_4_ = fVar151 * auVar120._12_4_ * fVar181;
                    local_af8 = minps(auVar99,_DAT_01f7ba10);
                    local_ca8 = (byte)uVar110;
                    uVar58 = (ulong)local_ca8;
                    uVar51 = 0;
                    if (uVar58 != 0) {
                      for (; (local_ca8 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    local_c98 = CONCAT44(uVar109,uVar109);
                    auVar92 = *local_c40;
                    do {
                      local_9a8 = *(undefined4 *)(local_b08 + uVar51 * 4);
                      local_998._4_4_ = *(undefined4 *)(local_af8 + uVar51 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_ae8 + uVar51 * 4);
                      args.context = context->user;
                      local_9d8 = *(undefined4 *)(local_ad8 + uVar51 * 4);
                      local_9c8._4_4_ = *(undefined4 *)(local_ac8 + uVar51 * 4);
                      local_9b8._4_4_ = *(undefined4 *)(local_ab8 + uVar51 * 4);
                      uStack_9d4 = local_9d8;
                      uStack_9d0 = local_9d8;
                      uStack_9cc = local_9d8;
                      local_9c8._0_4_ = local_9c8._4_4_;
                      local_9c8._8_4_ = local_9c8._4_4_;
                      local_9c8._12_4_ = local_9c8._4_4_;
                      local_9b8._0_4_ = local_9b8._4_4_;
                      local_9b8._8_4_ = local_9b8._4_4_;
                      local_9b8._12_4_ = local_9b8._4_4_;
                      uStack_9a4 = local_9a8;
                      uStack_9a0 = local_9a8;
                      uStack_99c = local_9a8;
                      local_998._0_4_ = local_998._4_4_;
                      local_998._8_4_ = local_998._4_4_;
                      local_998._12_4_ = local_998._4_4_;
                      local_988 = local_c98;
                      uStack_980 = CONCAT44(uVar109,uVar109);
                      local_978 = CONCAT44(uVar54,uVar54);
                      uStack_970 = CONCAT44(uVar54,uVar54);
                      local_968 = (args.context)->instID[0];
                      uStack_964 = local_968;
                      uStack_960 = local_968;
                      uStack_95c = local_968;
                      local_958 = (args.context)->instPrimID[0];
                      uStack_954 = local_958;
                      uStack_950 = local_958;
                      uStack_94c = local_958;
                      args.valid = (int *)local_c88;
                      args.geometryUserPtr = pGVar26->userPtr;
                      args.hit = (RTCHitN *)&local_9d8;
                      args.N = 4;
                      pGVar52 = (Geometry *)pGVar26->occlusionFilterN;
                      local_c88 = auVar92;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar52 != (Geometry *)0x0) {
                        pGVar52 = (Geometry *)(*(code *)pGVar52)(&args);
                      }
                      if (local_c88 == (undefined1  [16])0x0) {
                        auVar100._8_4_ = 0xffffffff;
                        auVar100._0_8_ = 0xffffffffffffffff;
                        auVar100._12_4_ = 0xffffffff;
                        auVar100 = auVar100 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var27 = context->args->filter;
                        if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var27)(&args);
                        }
                        auVar78._0_4_ = -(uint)(local_c88._0_4_ == 0);
                        auVar78._4_4_ = -(uint)(local_c88._4_4_ == 0);
                        auVar78._8_4_ = -(uint)(local_c88._8_4_ == 0);
                        auVar78._12_4_ = -(uint)(local_c88._12_4_ == 0);
                        auVar100 = auVar78 ^ _DAT_01f7ae20;
                        auVar114 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),
                                            auVar78);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar114;
                        pGVar52 = (Geometry *)args.ray;
                      }
                      if ((_DAT_01f7bb20 & auVar100) != (undefined1  [16])0x0) goto LAB_002a2970;
                      *(float *)(ray + k * 4 + 0x80) = fVar200;
                      uVar58 = uVar58 ^ 1L << (uVar51 & 0x3f);
                      uVar51 = 0;
                      if (uVar58 != 0) {
                        for (; (uVar58 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                        }
                      }
                    } while (uVar58 != 0);
                    local_a58 = *(float *)(ray + k * 4 + 0x10);
                    local_a68 = *(float *)(ray + k * 4 + 0x20);
                    fStack_d04 = *(float *)(ray + k * 4 + 0x40);
                    fVar180 = *(float *)(ray + k * 4 + 0x50);
                    fVar202 = *(float *)(ray + k * 4 + 0x60);
                    local_cb8 = local_948 - local_a58;
                    fStack_cb4 = fStack_944 - local_a58;
                    fStack_cb0 = fStack_940 - local_a58;
                    fStack_cac = fStack_93c - local_a58;
                    local_cc8._0_4_ = local_928 - local_a68;
                    local_cc8._4_4_ = fStack_924 - local_a68;
                    fStack_cc0 = fStack_920 - local_a68;
                    fStack_cbc = fStack_91c - local_a68;
                    fStack_a54 = local_a58;
                    fStack_a50 = local_a58;
                    fStack_a4c = local_a58;
                    fStack_a64 = local_a68;
                    fStack_a60 = local_a68;
                    fStack_a5c = local_a68;
                    fStack_a94 = fVar178 - local_a68;
                    local_a88 = local_cb8 + (local_938 - local_a58);
                    fStack_a84 = fStack_cb4 + (fStack_934 - local_a58);
                    fStack_a80 = fStack_cb0 + (fStack_930 - local_a58);
                    fStack_a7c = fStack_cac + (fStack_92c - local_a58);
                    local_a78 = (float)local_cc8 + (fVar199 - local_a68);
                    fStack_a74 = local_cc8._4_4_ + fStack_a94;
                    fStack_a70 = fStack_cc0 + (fStack_be0 - local_a68);
                    fStack_a6c = fStack_cbc + (fStack_bdc - local_a68);
                    local_a98 = fVar199 - local_a68;
                    fStack_a90 = fStack_be0 - local_a68;
                    fStack_a8c = fStack_bdc - local_a68;
                    local_aa8 = local_938 - local_a58;
                    fStack_aa4 = fStack_934 - local_a58;
                    fStack_aa0 = fStack_930 - local_a58;
                    fStack_a9c = fStack_92c - local_a58;
                  }
                }
              }
            }
            fVar192 = fVar192 - fStack_a5c;
            fVar205 = fStack_8b0 - fStack_a5c;
            fVar206 = (fStack_8c0 * ((float)uStack_c70 - (float)uStack_c60) + (float)uStack_c60) -
                      fStack_a5c;
            fVar207 = fStack_8d0 - fStack_a5c;
            fVar195 = fVar195 - fStack_a4c;
            fVar219 = fStack_8b4 - fStack_a4c;
            fVar221 = (fStack_8c4 * (local_c78._4_4_ - local_c68._4_4_) + local_c68._4_4_) -
                      fStack_a4c;
            fVar223 = fStack_8d4 - fStack_a4c;
            fVar200 = *(float *)(ray + k * 4);
            fVar191 = fVar191 - fVar200;
            fVar193 = local_8b8 - fVar200;
            fVar198 = (local_8c8 * ((float)local_c78 - (float)local_c68) + (float)local_c68) -
                      fVar200;
            fVar203 = local_8d8 - fVar200;
            fVar209 = (float)local_8a8 - fVar200;
            fVar213 = local_8a8._4_4_ - fVar200;
            fVar214 = fStack_8a0 - fVar200;
            fVar215 = fStack_89c - fVar200;
            fVar161 = local_898 - fVar200;
            fVar181 = fStack_894 - fVar200;
            fVar126 = fStack_890 - fVar200;
            fVar200 = fStack_88c - fVar200;
            fVar165 = fVar161 - fVar191;
            fVar174 = fVar181 - fVar193;
            fStack_be0 = fVar126 - fVar198;
            fStack_bdc = fVar200 - fVar203;
            fVar176 = local_aa8 - fVar195;
            fVar149 = fStack_aa4 - fVar219;
            fVar179 = fStack_aa0 - fVar221;
            fVar175 = fStack_a9c - fVar223;
            fVar231 = local_a98 - fVar192;
            fVar233 = fStack_a94 - fVar205;
            fVar235 = fStack_a90 - fVar206;
            fVar237 = fStack_a8c - fVar207;
            fVar91 = local_cb8 - local_aa8;
            fVar151 = fStack_cb4 - fStack_aa4;
            fVar178 = fStack_cb0 - fStack_aa0;
            fVar124 = fStack_cac - fStack_a9c;
            fVar224 = (float)local_cc8 - local_a98;
            fVar228 = local_cc8._4_4_ - fStack_a94;
            fVar229 = fStack_cc0 - fStack_a90;
            fVar230 = fStack_cbc - fStack_a8c;
            local_c68 = CONCAT44(fVar233,fVar231);
            uStack_c60 = CONCAT44(fVar237,fVar235);
            local_c78 = CONCAT44(fVar149,fVar176);
            uStack_c70 = CONCAT44(fVar175,fVar179);
            fVar183 = fVar191 - fVar209;
            fVar189 = fVar193 - fVar213;
            fVar194 = fVar198 - fVar214;
            fVar112 = fVar203 - fVar215;
            fVar232 = (fVar176 * (local_a98 + fVar192) - (local_aa8 + fVar195) * fVar231) *
                      fStack_d04 +
                      ((fVar161 + fVar191) * fVar231 - (local_a98 + fVar192) * fVar165) * fVar180 +
                      (fVar165 * (local_aa8 + fVar195) - (fVar161 + fVar191) * fVar176) * fVar202;
            fVar234 = (fVar149 * (fStack_a94 + fVar205) - (fStack_aa4 + fVar219) * fVar233) *
                      fStack_d04 +
                      ((fVar181 + fVar193) * fVar233 - (fStack_a94 + fVar205) * fVar174) * fVar180 +
                      (fVar174 * (fStack_aa4 + fVar219) - (fVar181 + fVar193) * fVar149) * fVar202;
            fVar236 = (fVar179 * (fStack_a90 + fVar206) - (fStack_aa0 + fVar221) * fVar235) *
                      fStack_d04 +
                      ((fVar126 + fVar198) * fVar235 - (fStack_a90 + fVar206) * fStack_be0) *
                      fVar180 + (fStack_be0 * (fStack_aa0 + fVar221) - (fVar126 + fVar198) * fVar179
                                ) * fVar202;
            fVar238 = (fVar175 * (fStack_a8c + fVar207) - (fStack_a9c + fVar223) * fVar237) *
                      fStack_d04 +
                      ((fVar200 + fVar203) * fVar237 - (fStack_a8c + fVar207) * fStack_bdc) *
                      fVar180 + (fStack_bdc * (fStack_a9c + fVar223) - (fVar200 + fVar203) * fVar175
                                ) * fVar202;
            fVar184 = fVar195 - local_cb8;
            fVar185 = fVar219 - fStack_cb4;
            fVar186 = fVar221 - fStack_cb0;
            fVar190 = fVar223 - fStack_cac;
            fVar199 = fVar192 - (float)local_cc8;
            fVar150 = fVar205 - local_cc8._4_4_;
            fVar166 = fVar206 - fStack_cc0;
            fVar177 = fVar207 - fStack_cbc;
            auVar156._0_4_ =
                 (fVar184 * ((float)local_cc8 + fVar192) - (local_cb8 + fVar195) * fVar199) *
                 fStack_d04 +
                 ((fVar191 + fVar209) * fVar199 - ((float)local_cc8 + fVar192) * fVar183) * fVar180
                 + (fVar183 * (local_cb8 + fVar195) - (fVar191 + fVar209) * fVar184) * fVar202;
            auVar156._4_4_ =
                 (fVar185 * (local_cc8._4_4_ + fVar205) - (fStack_cb4 + fVar219) * fVar150) *
                 fStack_d04 +
                 ((fVar193 + fVar213) * fVar150 - (local_cc8._4_4_ + fVar205) * fVar189) * fVar180 +
                 (fVar189 * (fStack_cb4 + fVar219) - (fVar193 + fVar213) * fVar185) * fVar202;
            auVar156._8_4_ =
                 (fVar186 * (fStack_cc0 + fVar206) - (fStack_cb0 + fVar221) * fVar166) * fStack_d04
                 + ((fVar198 + fVar214) * fVar166 - (fStack_cc0 + fVar206) * fVar194) * fVar180 +
                   (fVar194 * (fStack_cb0 + fVar221) - (fVar198 + fVar214) * fVar186) * fVar202;
            auVar156._12_4_ =
                 (fVar190 * (fStack_cbc + fVar207) - (fStack_cac + fVar223) * fVar177) * fStack_d04
                 + ((fVar203 + fVar215) * fVar177 - (fStack_cbc + fVar207) * fVar112) * fVar180 +
                   (fVar112 * (fStack_cac + fVar223) - (fVar203 + fVar215) * fVar190) * fVar202;
            fVar196 = fVar209 - fVar161;
            fVar197 = fVar213 - fVar181;
            fVar220 = fVar214 - fVar126;
            fVar222 = fVar215 - fVar200;
            auVar79._0_4_ =
                 (fVar91 * local_a78 - local_a88 * fVar224) * fStack_d04 +
                 ((fVar161 + fVar209) * fVar224 - local_a78 * fVar196) * fVar180 +
                 (fVar196 * local_a88 - (fVar161 + fVar209) * fVar91) * fVar202;
            auVar79._4_4_ =
                 (fVar151 * fStack_a74 - fStack_a84 * fVar228) * fStack_d04 +
                 ((fVar181 + fVar213) * fVar228 - fStack_a74 * fVar197) * fVar180 +
                 (fVar197 * fStack_a84 - (fVar181 + fVar213) * fVar151) * fVar202;
            auVar79._8_4_ =
                 (fVar178 * fStack_a70 - fStack_a80 * fVar229) * fStack_d04 +
                 ((fVar126 + fVar214) * fVar229 - fStack_a70 * fVar220) * fVar180 +
                 (fVar220 * fStack_a80 - (fVar126 + fVar214) * fVar178) * fVar202;
            auVar79._12_4_ =
                 (fVar124 * fStack_a6c - fStack_a7c * fVar230) * fStack_d04 +
                 ((fVar200 + fVar215) * fVar230 - fStack_a6c * fVar222) * fVar180 +
                 (fVar222 * fStack_a7c - (fVar200 + fVar215) * fVar124) * fVar202;
            auVar121._0_4_ = fVar232 + auVar156._0_4_ + auVar79._0_4_;
            auVar121._4_4_ = fVar234 + auVar156._4_4_ + auVar79._4_4_;
            auVar121._8_4_ = fVar236 + auVar156._8_4_ + auVar79._8_4_;
            auVar121._12_4_ = fVar238 + auVar156._12_4_ + auVar79._12_4_;
            auVar101._4_4_ = fVar234;
            auVar101._0_4_ = fVar232;
            auVar101._8_4_ = fVar236;
            auVar101._12_4_ = fVar238;
            auVar92 = minps(auVar101,auVar156);
            auVar92 = minps(auVar92,auVar79);
            auVar211._4_4_ = fVar234;
            auVar211._0_4_ = fVar232;
            auVar211._8_4_ = fVar236;
            auVar211._12_4_ = fVar238;
            auVar114 = maxps(auVar211,auVar156);
            auVar114 = maxps(auVar114,auVar79);
            fVar200 = ABS(auVar121._0_4_) * 1.1920929e-07;
            fVar161 = ABS(auVar121._4_4_) * 1.1920929e-07;
            fVar181 = ABS(auVar121._8_4_) * 1.1920929e-07;
            fVar126 = ABS(auVar121._12_4_) * 1.1920929e-07;
            auVar212._4_4_ = -(uint)(auVar114._4_4_ <= fVar161);
            auVar212._0_4_ = -(uint)(auVar114._0_4_ <= fVar200);
            auVar212._8_4_ = -(uint)(auVar114._8_4_ <= fVar181);
            auVar212._12_4_ = -(uint)(auVar114._12_4_ <= fVar126);
            auVar102._4_4_ = -(uint)(-fVar161 <= auVar92._4_4_);
            auVar102._0_4_ = -(uint)(-fVar200 <= auVar92._0_4_);
            auVar102._8_4_ = -(uint)(-fVar181 <= auVar92._8_4_);
            auVar102._12_4_ = -(uint)(-fVar126 <= auVar92._12_4_);
            auVar212 = auVar212 | auVar102;
            iVar48 = movmskps((int)pGVar52,auVar212);
            if (iVar48 != 0) {
              auVar157._0_4_ = fVar176 * fVar199 - fVar184 * fVar231;
              auVar157._4_4_ = fVar149 * fVar150 - fVar185 * fVar233;
              auVar157._8_4_ = fVar179 * fVar166 - fVar186 * fVar235;
              auVar157._12_4_ = fVar175 * fVar177 - fVar190 * fVar237;
              auVar141._0_4_ = fVar184 * fVar224 - fVar91 * fVar199;
              auVar141._4_4_ = fVar185 * fVar228 - fVar151 * fVar150;
              auVar141._8_4_ = fVar186 * fVar229 - fVar178 * fVar166;
              auVar141._12_4_ = fVar190 * fVar230 - fVar124 * fVar177;
              uVar54 = (uint)DAT_01f7b6c0;
              uVar110 = DAT_01f7b6c0._4_4_;
              uVar113 = DAT_01f7b6c0._8_4_;
              uVar123 = DAT_01f7b6c0._12_4_;
              auVar80._4_4_ =
                   -(uint)((float)((uint)(fVar185 * fVar233) & uVar110) <
                          (float)((uint)(fVar151 * fVar150) & uVar110));
              auVar80._0_4_ =
                   -(uint)((float)((uint)(fVar184 * fVar231) & uVar54) <
                          (float)((uint)(fVar91 * fVar199) & uVar54));
              auVar80._8_4_ =
                   -(uint)((float)((uint)(fVar186 * fVar235) & uVar113) <
                          (float)((uint)(fVar178 * fVar166) & uVar113));
              auVar80._12_4_ =
                   -(uint)((float)((uint)(fVar190 * fVar237) & uVar123) <
                          (float)((uint)(fVar124 * fVar177) & uVar123));
              local_ad8 = blendvps(auVar141,auVar157,auVar80);
              auVar227._0_4_ = fVar231 * fVar183 - fVar165 * fVar199;
              auVar227._4_4_ = fVar233 * fVar189 - fVar174 * fVar150;
              auVar227._8_4_ = fVar235 * fVar194 - fStack_be0 * fVar166;
              auVar227._12_4_ = fVar237 * fVar112 - fStack_bdc * fVar177;
              auVar148._0_4_ = fVar196 * fVar199 - fVar183 * fVar224;
              auVar148._4_4_ = fVar197 * fVar150 - fVar189 * fVar228;
              auVar148._8_4_ = fVar220 * fVar166 - fVar194 * fVar229;
              auVar148._12_4_ = fVar222 * fVar177 - fVar112 * fVar230;
              auVar81._4_4_ =
                   -(uint)((float)((uint)(fVar174 * fVar150) & uVar110) <
                          (float)((uint)(fVar189 * fVar228) & uVar110));
              auVar81._0_4_ =
                   -(uint)((float)((uint)(fVar165 * fVar199) & uVar54) <
                          (float)((uint)(fVar183 * fVar224) & uVar54));
              auVar81._8_4_ =
                   -(uint)((float)((uint)(fStack_be0 * fVar166) & uVar113) <
                          (float)((uint)(fVar194 * fVar229) & uVar113));
              auVar81._12_4_ =
                   -(uint)((float)((uint)(fStack_bdc * fVar177) & uVar123) <
                          (float)((uint)(fVar112 * fVar230) & uVar123));
              local_ac8 = blendvps(auVar148,auVar227,auVar81);
              auVar218._0_4_ = fVar183 * fVar91 - fVar196 * fVar184;
              auVar218._4_4_ = fVar189 * fVar151 - fVar197 * fVar185;
              auVar218._8_4_ = fVar194 * fVar178 - fVar220 * fVar186;
              auVar218._12_4_ = fVar112 * fVar124 - fVar222 * fVar190;
              auVar82._4_4_ =
                   -(uint)((float)((uint)(fVar189 * fVar149) & uVar110) <
                          (float)((uint)(fVar197 * fVar185) & uVar110));
              auVar82._0_4_ =
                   -(uint)((float)((uint)(fVar183 * fVar176) & uVar54) <
                          (float)((uint)(fVar196 * fVar184) & uVar54));
              auVar82._8_4_ =
                   -(uint)((float)((uint)(fVar194 * fVar179) & uVar113) <
                          (float)((uint)(fVar220 * fVar186) & uVar113));
              auVar82._12_4_ =
                   -(uint)((float)((uint)(fVar112 * fVar175) & uVar123) <
                          (float)((uint)(fVar222 * fVar190) & uVar123));
              auVar44._4_4_ = fVar174 * fVar185 - fVar189 * fVar149;
              auVar44._0_4_ = fVar165 * fVar184 - fVar183 * fVar176;
              auVar44._8_4_ = fStack_be0 * fVar186 - fVar194 * fVar179;
              auVar44._12_4_ = fStack_bdc * fVar190 - fVar112 * fVar175;
              local_ab8 = blendvps(auVar218,auVar44,auVar82);
              fVar200 = fStack_d04 * local_ad8._0_4_ +
                        fVar180 * local_ac8._0_4_ + fVar202 * local_ab8._0_4_;
              fVar91 = fStack_d04 * local_ad8._4_4_ +
                       fVar180 * local_ac8._4_4_ + fVar202 * local_ab8._4_4_;
              fVar151 = fStack_d04 * local_ad8._8_4_ +
                        fVar180 * local_ac8._8_4_ + fVar202 * local_ab8._8_4_;
              fVar180 = fStack_d04 * local_ad8._12_4_ +
                        fVar180 * local_ac8._12_4_ + fVar202 * local_ab8._12_4_;
              auVar158._0_4_ = fVar200 + fVar200;
              auVar158._4_4_ = fVar91 + fVar91;
              auVar158._8_4_ = fVar151 + fVar151;
              auVar158._12_4_ = fVar180 + fVar180;
              auVar103._0_4_ = fVar192 * local_ab8._0_4_;
              auVar103._4_4_ = fVar205 * local_ab8._4_4_;
              auVar103._8_4_ = fVar206 * local_ab8._8_4_;
              auVar103._12_4_ = fVar207 * local_ab8._12_4_;
              fVar151 = fVar191 * local_ad8._0_4_ + fVar195 * local_ac8._0_4_ + auVar103._0_4_;
              fVar161 = fVar193 * local_ad8._4_4_ + fVar219 * local_ac8._4_4_ + auVar103._4_4_;
              fVar178 = fVar198 * local_ad8._8_4_ + fVar221 * local_ac8._8_4_ + auVar103._8_4_;
              fVar181 = fVar203 * local_ad8._12_4_ + fVar223 * local_ac8._12_4_ + auVar103._12_4_;
              auVar92 = rcpps(auVar103,auVar158);
              fVar200 = auVar92._0_4_;
              fVar180 = auVar92._4_4_;
              fVar202 = auVar92._8_4_;
              fVar91 = auVar92._12_4_;
              local_ae8._0_4_ =
                   ((1.0 - auVar158._0_4_ * fVar200) * fVar200 + fVar200) * (fVar151 + fVar151);
              local_ae8._4_4_ =
                   ((1.0 - auVar158._4_4_ * fVar180) * fVar180 + fVar180) * (fVar161 + fVar161);
              local_ae8._8_4_ =
                   ((1.0 - auVar158._8_4_ * fVar202) * fVar202 + fVar202) * (fVar178 + fVar178);
              local_ae8._12_4_ =
                   ((1.0 - auVar158._12_4_ * fVar91) * fVar91 + fVar91) * (fVar181 + fVar181);
              fVar200 = *(float *)(ray + k * 4 + 0x80);
              fVar180 = *(float *)(ray + k * 4 + 0x30);
              auVar104._0_4_ =
                   -(uint)(local_ae8._0_4_ <= fVar200 && fVar180 <= local_ae8._0_4_) &
                   auVar212._0_4_;
              auVar104._4_4_ =
                   -(uint)(local_ae8._4_4_ <= fVar200 && fVar180 <= local_ae8._4_4_) &
                   auVar212._4_4_;
              auVar104._8_4_ =
                   -(uint)(local_ae8._8_4_ <= fVar200 && fVar180 <= local_ae8._8_4_) &
                   auVar212._8_4_;
              auVar104._12_4_ =
                   -(uint)(local_ae8._12_4_ <= fVar200 && fVar180 <= local_ae8._12_4_) &
                   auVar212._12_4_;
              iVar48 = movmskps(iVar48,auVar104);
              if (iVar48 != 0) {
                auVar105._0_4_ = auVar104._0_4_ & -(uint)(auVar158._0_4_ != 0.0);
                auVar105._4_4_ = auVar104._4_4_ & -(uint)(auVar158._4_4_ != 0.0);
                auVar105._8_4_ = auVar104._8_4_ & -(uint)(auVar158._8_4_ != 0.0);
                auVar105._12_4_ = auVar104._12_4_ & -(uint)(auVar158._12_4_ != 0.0);
                iVar48 = movmskps(iVar48,auVar105);
                if (iVar48 != 0) {
                  auVar122._0_4_ = auVar121._0_4_ - auVar156._0_4_;
                  auVar122._4_4_ = auVar121._4_4_ - auVar156._4_4_;
                  auVar122._8_4_ = auVar121._8_4_ - auVar156._8_4_;
                  auVar122._12_4_ = auVar121._12_4_ - auVar156._12_4_;
                  auVar106._4_12_ = auVar105._4_12_;
                  auVar106._0_4_ = (float)(int)(*(ushort *)(local_c30 + 8 + local_c38) - 1);
                  auVar159._4_4_ = auVar105._4_4_;
                  auVar159._0_4_ = auVar106._0_4_;
                  auVar159._8_4_ = auVar105._8_4_;
                  auVar159._12_4_ = auVar105._12_4_;
                  auVar92 = rcpss(auVar159,auVar106);
                  fVar180 = (2.0 - auVar106._0_4_ * auVar92._0_4_) * auVar92._0_4_;
                  auVar160._4_12_ = auVar92._4_12_;
                  auVar160._0_4_ = (float)(int)(*(ushort *)(local_c30 + 10 + local_c38) - 1);
                  auVar173._4_4_ = auVar92._4_4_;
                  auVar173._0_4_ = auVar160._0_4_;
                  auVar173._8_4_ = auVar92._8_4_;
                  auVar173._12_4_ = auVar92._12_4_;
                  auVar92 = rcpss(auVar173,auVar160);
                  fVar202 = (2.0 - auVar160._0_4_ * auVar92._0_4_) * auVar92._0_4_;
                  pGVar52 = (context->scene->geometries).items[_old_t_1].ptr;
                  if ((pGVar52->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar52->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002a2970:
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      return bVar67;
                    }
                    auVar92 = rcpps(auVar122,auVar121);
                    fVar91 = auVar92._0_4_;
                    fVar151 = auVar92._4_4_;
                    fVar161 = auVar92._8_4_;
                    fVar178 = auVar92._12_4_;
                    fVar91 = (float)(-(uint)(1e-18 <= ABS(auVar121._0_4_)) &
                                    (uint)(((float)DAT_01f7ba10 - auVar121._0_4_ * fVar91) * fVar91
                                          + fVar91));
                    fVar151 = (float)(-(uint)(1e-18 <= ABS(auVar121._4_4_)) &
                                     (uint)((DAT_01f7ba10._4_4_ - auVar121._4_4_ * fVar151) *
                                            fVar151 + fVar151));
                    fVar161 = (float)(-(uint)(1e-18 <= ABS(auVar121._8_4_)) &
                                     (uint)((DAT_01f7ba10._8_4_ - auVar121._8_4_ * fVar161) *
                                            fVar161 + fVar161));
                    fVar178 = (float)(-(uint)(1e-18 <= ABS(auVar121._12_4_)) &
                                     (uint)((DAT_01f7ba10._12_4_ - auVar121._12_4_ * fVar178) *
                                            fVar178 + fVar178));
                    auVar83._0_4_ =
                         fVar180 * ((float)uVar111 * auVar121._0_4_ + (auVar121._0_4_ - fVar232)) *
                         fVar91;
                    auVar83._4_4_ =
                         fVar180 * ((float)(uVar111 + 1) * auVar121._4_4_ +
                                   (auVar121._4_4_ - fVar234)) * fVar151;
                    auVar83._8_4_ =
                         fVar180 * ((float)(uVar111 + 1) * auVar121._8_4_ +
                                   (auVar121._8_4_ - fVar236)) * fVar161;
                    auVar83._12_4_ =
                         fVar180 * ((float)uVar111 * auVar121._12_4_ + (auVar121._12_4_ - fVar238))
                         * fVar178;
                    local_b08 = minps(auVar83,_DAT_01f7ba10);
                    auVar107._0_4_ =
                         fVar202 * ((float)(int)fVar201 * auVar121._0_4_ + auVar122._0_4_) * fVar91;
                    auVar107._4_4_ =
                         fVar202 * ((float)(int)fVar201 * auVar121._4_4_ + auVar122._4_4_) * fVar151
                    ;
                    auVar107._8_4_ =
                         fVar202 * ((float)((int)fVar201 + 1) * auVar121._8_4_ + auVar122._8_4_) *
                         fVar161;
                    auVar107._12_4_ =
                         fVar202 * ((float)((int)fVar201 + 1) * auVar121._12_4_ + auVar122._12_4_) *
                         fVar178;
                    local_af8 = minps(auVar107,_DAT_01f7ba10);
                    local_d38 = (byte)iVar48;
                    uVar58 = (ulong)local_d38;
                    uVar51 = 0;
                    if (uVar58 != 0) {
                      for (; (local_d38 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    uStack_ce0._0_4_ = old_t_1;
                    _old_t = CONCAT44((undefined4)uStack_ce0,(undefined4)uStack_ce0);
                    uStack_ce0._4_4_ = (undefined4)uStack_ce0;
                    local_cc8 = CONCAT44(uVar109,uVar109);
                    auVar47 = *(undefined1 (*) [12])*local_c40;
                    fStack_cac = (float)((ulong)*(undefined8 *)(*local_c40 + 8) >> 0x20);
                    _old_t_1 = ZEXT416((uint)fVar200);
                    local_a68 = fStack_a5c;
                    fStack_a64 = fStack_a5c;
                    fStack_a60 = fStack_a5c;
                    local_a58 = fStack_a4c;
                    fStack_a54 = fStack_a4c;
                    fStack_a50 = fStack_a4c;
                    do {
                      local_9a8 = *(undefined4 *)(local_b08 + uVar51 * 4);
                      uVar19 = *(undefined4 *)(local_af8 + uVar51 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_ae8 + uVar51 * 4);
                      args.context = context->user;
                      local_998._4_4_ = uVar19;
                      local_998._0_4_ = uVar19;
                      local_998._8_4_ = uVar19;
                      local_998._12_4_ = uVar19;
                      local_9d8 = *(undefined4 *)(local_ad8 + uVar51 * 4);
                      uVar19 = *(undefined4 *)(local_ac8 + uVar51 * 4);
                      uVar20 = *(undefined4 *)(local_ab8 + uVar51 * 4);
                      local_9c8._4_4_ = uVar19;
                      local_9c8._0_4_ = uVar19;
                      local_9c8._8_4_ = uVar19;
                      local_9c8._12_4_ = uVar19;
                      local_9b8._4_4_ = uVar20;
                      local_9b8._0_4_ = uVar20;
                      local_9b8._8_4_ = uVar20;
                      local_9b8._12_4_ = uVar20;
                      uStack_9d4 = local_9d8;
                      uStack_9d0 = local_9d8;
                      uStack_9cc = local_9d8;
                      uStack_9a4 = local_9a8;
                      uStack_9a0 = local_9a8;
                      uStack_99c = local_9a8;
                      local_988 = local_cc8;
                      uStack_980 = CONCAT44(uVar109,uVar109);
                      local_978 = _old_t;
                      uStack_970 = uStack_ce0;
                      local_968 = (args.context)->instID[0];
                      uStack_964 = local_968;
                      uStack_960 = local_968;
                      uStack_95c = local_968;
                      local_958 = (args.context)->instPrimID[0];
                      uStack_954 = local_958;
                      uStack_950 = local_958;
                      uStack_94c = local_958;
                      local_c88._12_4_ = fStack_cac;
                      local_c88._0_12_ = auVar47;
                      args.valid = (int *)local_c88;
                      args.geometryUserPtr = pGVar52->userPtr;
                      args.hit = (RTCHitN *)&local_9d8;
                      args.N = 4;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar52->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar52->occlusionFilterN)(&args);
                        fVar200 = old_t_1;
                      }
                      if (local_c88 == (undefined1  [16])0x0) {
                        auVar108._8_4_ = 0xffffffff;
                        auVar108._0_8_ = 0xffffffffffffffff;
                        auVar108._12_4_ = 0xffffffff;
                        auVar108 = auVar108 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var27 = context->args->filter;
                        if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar52->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var27)(&args);
                          fVar200 = old_t_1;
                        }
                        auVar84._0_4_ = -(uint)(local_c88._0_4_ == 0);
                        auVar84._4_4_ = -(uint)(local_c88._4_4_ == 0);
                        auVar84._8_4_ = -(uint)(local_c88._8_4_ == 0);
                        auVar84._12_4_ = -(uint)(local_c88._12_4_ == 0);
                        auVar108 = auVar84 ^ _DAT_01f7ae20;
                        auVar92 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),
                                           auVar84);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar92;
                      }
                      if ((_DAT_01f7bb20 & auVar108) != (undefined1  [16])0x0) goto LAB_002a2970;
                      *(float *)(ray + k * 4 + 0x80) = fVar200;
                      uVar58 = uVar58 ^ 1L << (uVar51 & 0x3f);
                      uVar51 = 0;
                      if (uVar58 != 0) {
                        for (; (uVar58 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                        }
                      }
                    } while (uVar58 != 0);
                  }
                }
              }
            }
            uVar59 = uVar59 & uVar59 - 1;
          } while (uVar59 != 0);
        }
        sVar53 = sVar53 + 1;
        aVar167 = bi_2.field_0;
      } while (sVar53 != sVar55);
    }
LAB_002a295a:
    bVar67 = pNVar64 != stack;
    if (!bVar67) {
      return bVar67;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }